

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void randomBlob(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_int64 sVar1;
  _func_void_void_ptr *xDel;
  void *in_RDX;
  int in_ESI;
  uchar *p;
  sqlite3_int64 n;
  int n_00;
  undefined4 in_stack_fffffffffffffff0;
  
  sVar1 = sqlite3_value_int64((sqlite3_value *)0x224a70);
  if (sVar1 < 1) {
    sVar1 = 0;
  }
  n_00 = (int)((ulong)sVar1 >> 0x20);
  xDel = (_func_void_void_ptr *)
         contextMalloc((sqlite3_context *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(i64)in_RDX);
  if (xDel != (_func_void_void_ptr *)0x0) {
    sqlite3_randomness(in_ESI,in_RDX);
    sqlite3_result_blob((sqlite3_context *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,n_00,
                        xDel);
  }
  return;
}

Assistant:

static void randomBlob(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  sqlite3_int64 n;
  unsigned char *p;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  n = sqlite3_value_int64(argv[0]);
  if( n<1 ){
    n = 1;
  }
  p = contextMalloc(context, n);
  if( p ){
    sqlite3_randomness(n, p);
    sqlite3_result_blob(context, (char*)p, n, sqlite3_free);
  }
}